

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_request.cpp
# Opt level: O2

bool __thiscall
cppcms::http::request::parse_form_urlencoded(request *this,char *begin,char *end,form_type *out)

{
  util *begin_00;
  util *begin_01;
  form_type *end_00;
  string value;
  string name;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  string local_70;
  string local_50;
  
  end_00 = out;
  while (begin < end) {
    local_b0.first._M_dataplus._M_p._0_1_ = 0x26;
    begin_00 = (util *)std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                                 (begin,end,&local_b0);
    local_b0.first._M_dataplus._M_p._0_1_ = 0x3d;
    begin_01 = (util *)std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                                 (begin,begin_00,&local_b0);
    if ((begin_01 == begin_00) || (begin_01 == (util *)begin)) break;
    util::urldecode_abi_cxx11_(&local_50,(util *)begin,(char *)begin_01,(char *)end_00);
    util::urldecode_abi_cxx11_(&local_70,begin_01 + 1,(char *)begin_00,(char *)end_00);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_b0,&local_50,&local_70);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)out,&local_b0);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    begin = (char *)(begin_00 + 1);
  }
  return end <= begin;
}

Assistant:

bool request::parse_form_urlencoded(char const *begin,char const *end,form_type &out)
{
	char const *p;
	for(p=begin;p<end;) {
		char const *e=std::find(p,end,'&');
		char const *name_end=std::find(p,e,'=');
		if(name_end==e || name_end==p)
			return false;
		std::string name=util::urldecode(p,name_end);
		std::string value=util::urldecode(name_end+1,e);
		out.insert(std::make_pair(name,value));
		p=e+1;
	}
	return true;
}